

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

TokenOrSyntax * __thiscall
slang::syntax::StreamingConcatenationExpressionSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,StreamingConcatenationExpressionSyntax *this,
          size_t index)

{
  Token local_20;
  
  switch(index) {
  case 0:
    local_20.kind = (this->openBrace).kind;
    local_20._2_1_ = (this->openBrace).field_0x2;
    local_20.numFlags.raw = (this->openBrace).numFlags.raw;
    local_20.rawLen = (this->openBrace).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->openBrace).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->openBrace).info + 4);
    break;
  case 1:
    local_20.kind = (this->operatorToken).kind;
    local_20._2_1_ = (this->operatorToken).field_0x2;
    local_20.numFlags.raw = (this->operatorToken).numFlags.raw;
    local_20.rawLen = (this->operatorToken).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->operatorToken).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->operatorToken).info + 4);
    break;
  case 2:
    *(ExpressionSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         this->sliceSize;
    goto LAB_005c4d16;
  case 3:
    local_20.kind = (this->innerOpenBrace).kind;
    local_20._2_1_ = (this->innerOpenBrace).field_0x2;
    local_20.numFlags.raw = (this->innerOpenBrace).numFlags.raw;
    local_20.rawLen = (this->innerOpenBrace).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->innerOpenBrace).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->innerOpenBrace).info + 4);
    break;
  case 4:
    *(SyntaxNode **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(this->expressions).super_SyntaxListBase.super_SyntaxNode;
LAB_005c4d16:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\x01';
    return __return_storage_ptr__;
  case 5:
    local_20.kind = (this->innerCloseBrace).kind;
    local_20._2_1_ = (this->innerCloseBrace).field_0x2;
    local_20.numFlags.raw = (this->innerCloseBrace).numFlags.raw;
    local_20.rawLen = (this->innerCloseBrace).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->innerCloseBrace).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->innerCloseBrace).info + 4);
    break;
  case 6:
    local_20.kind = (this->closeBrace).kind;
    local_20._2_1_ = (this->closeBrace).field_0x2;
    local_20.numFlags.raw = (this->closeBrace).numFlags.raw;
    local_20.rawLen = (this->closeBrace).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->closeBrace).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->closeBrace).info + 4);
    break;
  default:
    parsing::Token::Token(&local_20);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       local_20._0_4_;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
       local_20.rawLen;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
       local_20.info._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc) =
       local_20.info._4_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax StreamingConcatenationExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openBrace;
        case 1: return operatorToken;
        case 2: return sliceSize;
        case 3: return innerOpenBrace;
        case 4: return &expressions;
        case 5: return innerCloseBrace;
        case 6: return closeBrace;
        default: return nullptr;
    }
}